

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

int side3_4d_filter(double *p0,double *p1,double *p2,double *p3,double *q0,double *q1,double *q2)

{
  int iVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  
  dVar33 = *p0;
  dVar30 = p0[1];
  dVar36 = *p1 - dVar33;
  dVar31 = p1[1] - dVar30;
  dVar25 = p0[2];
  dVar23 = p1[2] - dVar25;
  dVar21 = p0[3];
  dVar4 = p1[3] - dVar21;
  dVar12 = *p2 - dVar33;
  dVar38 = p2[1] - dVar30;
  dVar27 = p2[2] - dVar25;
  dVar19 = p2[3] - dVar21;
  dVar17 = ABS(dVar31);
  if (ABS(dVar31) <= ABS(dVar4)) {
    dVar17 = ABS(dVar4);
  }
  dVar5 = ABS(dVar23);
  if (ABS(dVar23) <= dVar17) {
    dVar5 = dVar17;
  }
  dVar17 = ABS(dVar36);
  if (ABS(dVar36) <= dVar5) {
    dVar17 = dVar5;
  }
  dVar5 = ABS(dVar27);
  if (ABS(dVar27) <= ABS(dVar19)) {
    dVar5 = ABS(dVar19);
  }
  dVar6 = ABS(dVar12);
  if (ABS(dVar12) <= dVar5) {
    dVar6 = dVar5;
  }
  dVar5 = ABS(dVar38);
  if (ABS(dVar38) <= dVar6) {
    dVar5 = dVar6;
  }
  dVar13 = *q0 - dVar33;
  dVar41 = q0[1] - dVar30;
  dVar6 = ABS(dVar13);
  if (ABS(dVar13) <= ABS(dVar41)) {
    dVar6 = ABS(dVar41);
  }
  dVar7 = q0[2] - dVar25;
  dVar10 = ABS(dVar7);
  if (ABS(dVar7) <= dVar6) {
    dVar10 = dVar6;
  }
  dVar39 = q0[3] - dVar21;
  dVar6 = ABS(dVar39);
  if (ABS(dVar39) <= dVar10) {
    dVar6 = dVar10;
  }
  dVar28 = *q1 - dVar33;
  dVar10 = ABS(dVar28);
  if (ABS(dVar28) <= dVar6) {
    dVar10 = dVar6;
  }
  dVar14 = q1[1] - dVar30;
  dVar6 = ABS(dVar14);
  if (ABS(dVar14) <= dVar10) {
    dVar6 = dVar10;
  }
  dVar8 = q1[2] - dVar25;
  dVar10 = ABS(dVar8);
  if (ABS(dVar8) <= dVar6) {
    dVar10 = dVar6;
  }
  dVar15 = q1[3] - dVar21;
  dVar6 = ABS(dVar15);
  if (ABS(dVar15) <= dVar10) {
    dVar6 = dVar10;
  }
  dVar45 = *q2 - dVar33;
  dVar10 = ABS(dVar45);
  if (ABS(dVar45) <= dVar6) {
    dVar10 = dVar6;
  }
  dVar24 = q2[1] - dVar30;
  dVar6 = ABS(dVar24);
  if (ABS(dVar24) <= dVar10) {
    dVar6 = dVar10;
  }
  dVar9 = q2[2] - dVar25;
  dVar10 = ABS(dVar9);
  if (ABS(dVar9) <= dVar6) {
    dVar10 = dVar6;
  }
  dVar37 = q2[3] - dVar21;
  dVar6 = ABS(dVar37);
  if (ABS(dVar37) <= dVar10) {
    dVar6 = dVar10;
  }
  dVar10 = dVar5;
  dVar16 = dVar17;
  if ((dVar17 <= dVar5) && (dVar10 = dVar17, dVar17 < dVar5)) {
    dVar16 = dVar5;
  }
  dVar18 = dVar6;
  if ((dVar10 <= dVar6) && (dVar18 = dVar10, dVar16 < dVar6)) {
    dVar16 = dVar6;
  }
  iVar1 = 0;
  iVar3 = 0;
  if ((1.895283954029418e-74 <= dVar18) && (iVar3 = iVar1, dVar16 <= 1.2980742146337065e+33)) {
    dVar16 = dVar4 * dVar39 + dVar23 * dVar7 + dVar36 * dVar13 + dVar31 * dVar41;
    dVar10 = dVar4 * dVar15 + dVar23 * dVar8 + dVar36 * dVar28 + dVar31 * dVar14;
    dVar32 = dVar4 * dVar37 + dVar23 * dVar9 + dVar36 * dVar45 + dVar31 * dVar24;
    dVar40 = dVar19 * dVar39 + dVar27 * dVar7 + dVar12 * dVar13 + dVar38 * dVar41;
    dVar22 = dVar19 * dVar15 + dVar27 * dVar8 + dVar12 * dVar28 + dVar38 * dVar14;
    dVar46 = dVar19 * dVar37 + dVar27 * dVar9 + dVar12 * dVar45 + dVar38 * dVar24;
    dVar16 = dVar16 + dVar16;
    dVar10 = dVar10 + dVar10;
    dVar32 = dVar32 + dVar32;
    dVar40 = dVar40 + dVar40;
    dVar22 = dVar22 + dVar22;
    dVar46 = dVar46 + dVar46;
    dVar42 = dVar10 * dVar46 - dVar22 * dVar32;
    dVar29 = dVar32 * dVar40 - dVar46 * dVar16;
    dVar20 = dVar16 * dVar22 - dVar40 * dVar10;
    dVar43 = dVar17 * dVar6 * dVar5 * dVar6 * 1.7244368241093199e-13;
    dVar18 = dVar42 + dVar29 + dVar20;
    iVar1 = 1;
    if ((dVar43 < dVar18) || (iVar1 = -1, dVar18 < -dVar43)) {
      dVar33 = *p3 - dVar33;
      dVar30 = p3[1] - dVar30;
      dVar25 = p3[2] - dVar25;
      dVar21 = p3[3] - dVar21;
      dVar43 = ABS(dVar33);
      if (ABS(dVar33) <= dVar17) {
        dVar43 = dVar17;
      }
      dVar11 = ABS(dVar21);
      if (ABS(dVar21) <= dVar43) {
        dVar11 = dVar43;
      }
      dVar43 = ABS(dVar25);
      if (ABS(dVar25) <= dVar11) {
        dVar43 = dVar11;
      }
      dVar11 = ABS(dVar30);
      if (ABS(dVar30) <= dVar43) {
        dVar11 = dVar43;
      }
      dVar43 = dVar11;
      if (dVar11 <= dVar17) {
        dVar43 = dVar17;
      }
      dVar26 = dVar6;
      if (dVar6 <= dVar43) {
        dVar26 = dVar43;
      }
      dVar43 = dVar6;
      if (dVar6 <= dVar17) {
        dVar43 = dVar17;
      }
      dVar34 = dVar43;
      if (dVar43 <= dVar26) {
        dVar34 = dVar26;
      }
      dVar26 = dVar34;
      if (dVar34 <= dVar17) {
        dVar26 = dVar17;
      }
      dVar17 = dVar11;
      if (dVar11 <= dVar26) {
        dVar17 = dVar26;
      }
      dVar26 = dVar5;
      if (dVar5 <= dVar17) {
        dVar26 = dVar17;
      }
      dVar17 = dVar6;
      if (dVar6 <= dVar26) {
        dVar17 = dVar26;
      }
      dVar26 = dVar43;
      if (dVar43 <= dVar17) {
        dVar26 = dVar17;
      }
      dVar17 = dVar11;
      if (dVar34 <= dVar11) {
        dVar17 = dVar34;
      }
      dVar35 = dVar5;
      if (dVar17 <= dVar5) {
        dVar35 = dVar17;
      }
      dVar17 = dVar6;
      if (dVar35 <= dVar6) {
        dVar17 = dVar35;
      }
      dVar35 = dVar26;
      dVar44 = dVar34;
      if ((dVar17 <= dVar26) && (dVar35 = dVar17, dVar34 < dVar26)) {
        dVar44 = dVar26;
      }
      if (dVar44 <= 1.2980742146337065e+33) {
        dVar17 = dVar43;
        if (dVar35 <= dVar43) {
          dVar17 = dVar35;
        }
        if (4.1460764440172624e-50 <= dVar17) {
          dVar23 = dVar4 * dVar4 + dVar23 * dVar23 + dVar36 * dVar36 + dVar31 * dVar31;
          dVar12 = dVar19 * dVar19 + dVar27 * dVar27 + dVar12 * dVar12 + dVar38 * dVar38;
          dVar27 = dVar39 * dVar21 + dVar7 * dVar25 + dVar13 * dVar33 + dVar41 * dVar30;
          dVar4 = dVar15 * dVar21 + dVar8 * dVar25 + dVar28 * dVar33 + dVar14 * dVar30;
          dVar17 = dVar37 * dVar21 + dVar9 * dVar25 + dVar45 * dVar33 + dVar24 * dVar30;
          dVar19 = dVar5 * dVar11 * dVar6 * dVar43 * dVar34 * dVar26 * 4.380468888011788e-12;
          dVar33 = dVar18 * (dVar21 * dVar21 + dVar25 * dVar25 + dVar33 * dVar33 + dVar30 * dVar30)
                   - ((dVar20 + (dVar40 - dVar22) * dVar23 + (dVar10 - dVar16) * dVar12) *
                      (dVar17 + dVar17) +
                     (dVar29 + (dVar46 - dVar40) * dVar23 + (dVar16 - dVar32) * dVar12) *
                     (dVar4 + dVar4) +
                     (dVar42 + (dVar22 - dVar46) * dVar23 + (dVar32 - dVar10) * dVar12) *
                     (dVar27 + dVar27));
          iVar2 = 1;
          if ((dVar19 < dVar33) || (iVar2 = -1, dVar33 < -dVar19)) {
            iVar3 = iVar2 * iVar1;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

inline int side3_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3, const double* q0, const double* q1, const double* q2) {
    double p1_0_p0_0 = (p1[0] - p0[0]);
    double p1_1_p0_1 = (p1[1] - p0[1]);
    double p1_2_p0_2 = (p1[2] - p0[2]);
    double p1_3_p0_3 = (p1[3] - p0[3]);
    double l1;
    l1 = (1 * ((((p1_0_p0_0 * p1_0_p0_0) + (p1_1_p0_1 * p1_1_p0_1)) + (p1_2_p0_2 * p1_2_p0_2)) + (p1_3_p0_3 * p1_3_p0_3)));
    double p2_0_p0_0 = (p2[0] - p0[0]);
    double p2_1_p0_1 = (p2[1] - p0[1]);
    double p2_2_p0_2 = (p2[2] - p0[2]);
    double p2_3_p0_3 = (p2[3] - p0[3]);
    double l2;
    l2 = (1 * ((((p2_0_p0_0 * p2_0_p0_0) + (p2_1_p0_1 * p2_1_p0_1)) + (p2_2_p0_2 * p2_2_p0_2)) + (p2_3_p0_3 * p2_3_p0_3)));
    double p3_0_p0_0 = (p3[0] - p0[0]);
    double p3_1_p0_1 = (p3[1] - p0[1]);
    double p3_2_p0_2 = (p3[2] - p0[2]);
    double p3_3_p0_3 = (p3[3] - p0[3]);
    double l3;
    l3 = (1 * ((((p3_0_p0_0 * p3_0_p0_0) + (p3_1_p0_1 * p3_1_p0_1)) + (p3_2_p0_2 * p3_2_p0_2)) + (p3_3_p0_3 * p3_3_p0_3)));
    double q0_0_p0_0 = (q0[0] - p0[0]);
    double q0_1_p0_1 = (q0[1] - p0[1]);
    double q0_2_p0_2 = (q0[2] - p0[2]);
    double q0_3_p0_3 = (q0[3] - p0[3]);
    double a10;
    a10 = (2 * ((((p1_0_p0_0 * q0_0_p0_0) + (p1_1_p0_1 * q0_1_p0_1)) + (p1_2_p0_2 * q0_2_p0_2)) + (p1_3_p0_3 * q0_3_p0_3)));
    double q1_0_p0_0 = (q1[0] - p0[0]);
    double q1_1_p0_1 = (q1[1] - p0[1]);
    double q1_2_p0_2 = (q1[2] - p0[2]);
    double q1_3_p0_3 = (q1[3] - p0[3]);
    double a11;
    a11 = (2 * ((((p1_0_p0_0 * q1_0_p0_0) + (p1_1_p0_1 * q1_1_p0_1)) + (p1_2_p0_2 * q1_2_p0_2)) + (p1_3_p0_3 * q1_3_p0_3)));
    double q2_0_p0_0 = (q2[0] - p0[0]);
    double q2_1_p0_1 = (q2[1] - p0[1]);
    double q2_2_p0_2 = (q2[2] - p0[2]);
    double q2_3_p0_3 = (q2[3] - p0[3]);
    double a12;
    a12 = (2 * ((((p1_0_p0_0 * q2_0_p0_0) + (p1_1_p0_1 * q2_1_p0_1)) + (p1_2_p0_2 * q2_2_p0_2)) + (p1_3_p0_3 * q2_3_p0_3)));
    double a20;
    a20 = (2 * ((((p2_0_p0_0 * q0_0_p0_0) + (p2_1_p0_1 * q0_1_p0_1)) + (p2_2_p0_2 * q0_2_p0_2)) + (p2_3_p0_3 * q0_3_p0_3)));
    double a21;
    a21 = (2 * ((((p2_0_p0_0 * q1_0_p0_0) + (p2_1_p0_1 * q1_1_p0_1)) + (p2_2_p0_2 * q1_2_p0_2)) + (p2_3_p0_3 * q1_3_p0_3)));
    double a22;
    a22 = (2 * ((((p2_0_p0_0 * q2_0_p0_0) + (p2_1_p0_1 * q2_1_p0_1)) + (p2_2_p0_2 * q2_2_p0_2)) + (p2_3_p0_3 * q2_3_p0_3)));
    double a30;
    a30 = (2 * ((((p3_0_p0_0 * q0_0_p0_0) + (p3_1_p0_1 * q0_1_p0_1)) + (p3_2_p0_2 * q0_2_p0_2)) + (p3_3_p0_3 * q0_3_p0_3)));
    double a31;
    a31 = (2 * ((((p3_0_p0_0 * q1_0_p0_0) + (p3_1_p0_1 * q1_1_p0_1)) + (p3_2_p0_2 * q1_2_p0_2)) + (p3_3_p0_3 * q1_3_p0_3)));
    double a32;
    a32 = (2 * ((((p3_0_p0_0 * q2_0_p0_0) + (p3_1_p0_1 * q2_1_p0_1)) + (p3_2_p0_2 * q2_2_p0_2)) + (p3_3_p0_3 * q2_3_p0_3)));
    double b00;
    b00 = ((a11 * a22) - (a12 * a21));
    double b01;
    b01 = (a21 - a22);
    double b02;
    b02 = (a12 - a11);
    double b10;
    b10 = ((a12 * a20) - (a10 * a22));
    double b11;
    b11 = (a22 - a20);
    double b12;
    b12 = (a10 - a12);
    double b20;
    b20 = ((a10 * a21) - (a11 * a20));
    double b21;
    b21 = (a20 - a21);
    double b22;
    b22 = (a11 - a10);
    double Delta;
    Delta = ((b00 + b10) + b20);
    double DeltaLambda0;
    DeltaLambda0 = (((b01 * l1) + (b02 * l2)) + b00);
    double DeltaLambda1;
    DeltaLambda1 = (((b11 * l1) + (b12 * l2)) + b10);
    double DeltaLambda2;
    DeltaLambda2 = (((b21 * l1) + (b22 * l2)) + b20);
    double r;
    r = ((Delta * l3) - (((a30 * DeltaLambda0) + (a31 * DeltaLambda1)) + (a32 * DeltaLambda2)));
    double eps;
    double max1 = fabs(p1_3_p0_3);
    if( (max1 < fabs(p1_1_p0_1)) )
    {
        max1 = fabs(p1_1_p0_1);
    } 
    if( (max1 < fabs(p1_2_p0_2)) )
    {
        max1 = fabs(p1_2_p0_2);
    } 
    if( (max1 < fabs(p1_0_p0_0)) )
    {
        max1 = fabs(p1_0_p0_0);
    } 
    double max2 = fabs(p2_3_p0_3);
    if( (max2 < fabs(p2_2_p0_2)) )
    {
        max2 = fabs(p2_2_p0_2);
    } 
    if( (max2 < fabs(p2_0_p0_0)) )
    {
        max2 = fabs(p2_0_p0_0);
    } 
    if( (max2 < fabs(p2_1_p0_1)) )
    {
        max2 = fabs(p2_1_p0_1);
    } 
    double max3 = fabs(q0_1_p0_1);
    if( (max3 < fabs(q0_0_p0_0)) )
    {
        max3 = fabs(q0_0_p0_0);
    } 
    if( (max3 < fabs(q0_2_p0_2)) )
    {
        max3 = fabs(q0_2_p0_2);
    } 
    if( (max3 < fabs(q0_3_p0_3)) )
    {
        max3 = fabs(q0_3_p0_3);
    } 
    if( (max3 < fabs(q1_0_p0_0)) )
    {
        max3 = fabs(q1_0_p0_0);
    } 
    if( (max3 < fabs(q1_1_p0_1)) )
    {
        max3 = fabs(q1_1_p0_1);
    } 
    if( (max3 < fabs(q1_2_p0_2)) )
    {
        max3 = fabs(q1_2_p0_2);
    } 
    if( (max3 < fabs(q1_3_p0_3)) )
    {
        max3 = fabs(q1_3_p0_3);
    } 
    if( (max3 < fabs(q2_0_p0_0)) )
    {
        max3 = fabs(q2_0_p0_0);
    } 
    if( (max3 < fabs(q2_1_p0_1)) )
    {
        max3 = fabs(q2_1_p0_1);
    } 
    if( (max3 < fabs(q2_2_p0_2)) )
    {
        max3 = fabs(q2_2_p0_2);
    } 
    if( (max3 < fabs(q2_3_p0_3)) )
    {
        max3 = fabs(q2_3_p0_3);
    } 
    double lower_bound_1;
    double upper_bound_1;
    int Delta_sign;
    int int_tmp_result;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (lower_bound_1 < 1.89528395402941802921e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (1.72443682410931985179e-13 * (((max1 * max3) * max2) * max3));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    Delta_sign = int_tmp_result;
    double max4 = max1;
    double max5 = max1;
    double max6 = max1;
    if( (max6 < fabs(p3_0_p0_0)) )
    {
        max6 = fabs(p3_0_p0_0);
    } 
    if( (max6 < fabs(p3_3_p0_3)) )
    {
        max6 = fabs(p3_3_p0_3);
    } 
    if( (max6 < fabs(p3_2_p0_2)) )
    {
        max6 = fabs(p3_2_p0_2);
    } 
    if( (max6 < fabs(p3_1_p0_1)) )
    {
        max6 = fabs(p3_1_p0_1);
    } 
    if( (max5 < max6) )
    {
        max5 = max6;
    } 
    if( (max5 < max3) )
    {
        max5 = max3;
    } 
    double max7 = max1;
    if( (max7 < max3) )
    {
        max7 = max3;
    } 
    if( (max5 < max7) )
    {
        max5 = max7;
    } 
    if( (max4 < max5) )
    {
        max4 = max5;
    } 
    if( (max4 < max6) )
    {
        max4 = max6;
    } 
    if( (max4 < max2) )
    {
        max4 = max2;
    } 
    if( (max4 < max3) )
    {
        max4 = max3;
    } 
    if( (max4 < max7) )
    {
        max4 = max7;
    } 
    int r_sign;
    int int_tmp_result_FFWKCAA;
    lower_bound_1 = max5;
    upper_bound_1 = max5;
    if( (max6 < lower_bound_1) )
    {
        lower_bound_1 = max6;
    } 
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (max7 < lower_bound_1) )
    {
        lower_bound_1 = max7;
    } 
    if( (lower_bound_1 < 4.14607644401726239868e-50) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.29807421463370647479e+33) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (4.38046888801178809320e-12 * (((((max6 * max3) * max2) * max7) * max5) * max4));
        if( (r > eps) )
        {
            int_tmp_result_FFWKCAA = 1;
        } 
        else 
        {
            if( (r < -eps) )
            {
                int_tmp_result_FFWKCAA = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    r_sign = int_tmp_result_FFWKCAA;
    return (Delta_sign * r_sign);
}